

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O0

value_type __thiscall
FadExpr<FadFuncExp<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>::dx
          (FadExpr<FadFuncExp<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_> *this,int i)

{
  undefined8 in_RDI;
  value_type vVar1;
  FadFuncExp<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_> *unaff_retaddr;
  
  vVar1 = FadFuncExp<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>::dx
                    (unaff_retaddr,(int)((ulong)in_RDI >> 0x20));
  return vVar1;
}

Assistant:

value_type dx(int i) const { return fadexpr_.dx(i);}